

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__pic_info(stbi__context *s,int *x,int *y,int *comp)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  stbi_uc *psVar8;
  byte *pbVar9;
  uint unaff_R13D;
  bool bVar10;
  
  iVar6 = stbi__pic_is4(s,anon_var_dwarf_412c4);
  if (iVar6 == 0) goto LAB_0016d17f;
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0016d10c:
    s->img_buffer = s->img_buffer + 0x58;
  }
  else {
    iVar6 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (0x57 < iVar6) goto LAB_0016d10c;
    s->img_buffer = s->img_buffer_end;
    (*(s->io).skip)(s->io_user_data,0x58 - iVar6);
  }
  iVar6 = stbi__get16be(s);
  *x = iVar6;
  iVar6 = stbi__get16be(s);
  *y = iVar6;
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0016d145:
    if (s->img_buffer_end <= s->img_buffer) {
LAB_0016d17f:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      return 0;
    }
  }
  else {
    iVar6 = (*(s->io).eof)(s->io_user_data);
    if (iVar6 != 0) {
      if (s->read_from_callbacks == 0) goto LAB_0016d17f;
      goto LAB_0016d145;
    }
  }
  if ((*x != 0) && ((int)(0x10000000 / (long)*x) < *y)) {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    return 0;
  }
  if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
    iVar6 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (iVar6 < 8) {
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,8 - iVar6);
      goto LAB_0016d1e5;
    }
  }
  s->img_buffer = s->img_buffer + 8;
LAB_0016d1e5:
  psVar1 = s->buffer_start;
  psVar2 = s->buffer_start + 1;
  bVar3 = 0;
  iVar6 = 0;
  do {
    if (iVar6 == 10) {
LAB_0016d437:
      bVar4 = false;
    }
    else {
      pbVar9 = s->img_buffer;
      if (pbVar9 < s->img_buffer_end) {
LAB_0016d272:
        s->img_buffer = pbVar9 + 1;
        unaff_R13D = (uint)*pbVar9;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
          if (iVar7 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar2;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar1 + iVar7;
          }
          pbVar9 = s->img_buffer;
          goto LAB_0016d272;
        }
        unaff_R13D = 0;
      }
      psVar8 = s->img_buffer;
      if (psVar8 < s->img_buffer_end) {
LAB_0016d2ec:
        s->img_buffer = psVar8 + 1;
        bVar10 = *psVar8 == '\b';
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
          if (iVar7 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar2;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar1 + iVar7;
          }
          psVar8 = s->img_buffer;
          goto LAB_0016d2ec;
        }
        bVar10 = false;
      }
      psVar8 = s->img_buffer;
      if (psVar8 < s->img_buffer_end) {
LAB_0016d364:
        s->img_buffer = psVar8 + 1;
      }
      else if (s->read_from_callbacks != 0) {
        iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        if (iVar7 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar1;
          s->img_buffer_end = psVar2;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar1;
          s->img_buffer_end = psVar1 + iVar7;
        }
        psVar8 = s->img_buffer;
        goto LAB_0016d364;
      }
      pbVar9 = s->img_buffer;
      if (pbVar9 < s->img_buffer_end) {
LAB_0016d3d8:
        s->img_buffer = pbVar9 + 1;
        bVar5 = *pbVar9;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
          if (iVar7 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar2;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar1 + iVar7;
          }
          pbVar9 = s->img_buffer;
          goto LAB_0016d3d8;
        }
        bVar5 = 0;
      }
      iVar6 = iVar6 + 1;
      bVar3 = bVar3 | bVar5;
      if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
        iVar7 = (*(s->io).eof)(s->io_user_data);
        if (iVar7 == 0) {
          bVar4 = true;
          if (bVar10) goto LAB_0016d439;
        }
        else if (s->read_from_callbacks != 0) goto LAB_0016d406;
LAB_0016d427:
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        goto LAB_0016d437;
      }
LAB_0016d406:
      if ((s->img_buffer_end <= s->img_buffer) || (bVar4 = true, !bVar10)) goto LAB_0016d427;
    }
LAB_0016d439:
    if (!bVar4) {
      return 0;
    }
    if (unaff_R13D == 0) {
      *comp = 4 - (uint)((bVar3 & 0x10) == 0);
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__pic_info(stbi__context *s, int *x, int *y, int *comp)
{
   int act_comp=0,num_packets=0,chained;
   stbi__pic_packet packets[10];

   if (!stbi__pic_is4(s,"\x53\x80\xF6\x34")) {
      stbi__rewind(s);
      return 0;
   }

   stbi__skip(s, 88);

   *x = stbi__get16be(s);
   *y = stbi__get16be(s);
   if (stbi__at_eof(s)) {
      stbi__rewind( s);
      return 0;
   }
   if ( (*x) != 0 && (1 << 28) / (*x) < (*y)) {
      stbi__rewind( s );
      return 0;
   }

   stbi__skip(s, 8);

   do {
      stbi__pic_packet *packet;

      if (num_packets==sizeof(packets)/sizeof(packets[0]))
         return 0;

      packet = &packets[num_packets++];
      chained = stbi__get8(s);
      packet->size    = stbi__get8(s);
      packet->type    = stbi__get8(s);
      packet->channel = stbi__get8(s);
      act_comp |= packet->channel;

      if (stbi__at_eof(s)) {
          stbi__rewind( s );
          return 0;
      }
      if (packet->size != 8) {
          stbi__rewind( s );
          return 0;
      }
   } while (chained);

   *comp = (act_comp & 0x10 ? 4 : 3);

   return 1;
}